

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileInfo.cpp
# Opt level: O1

FileInfo * __thiscall efsw::FileInfo::operator=(FileInfo *this,FileInfo *Other)

{
  std::__cxx11::string::_M_assign((string *)this);
  this->Size = Other->Size;
  this->ModificationTime = Other->ModificationTime;
  this->GroupId = Other->GroupId;
  this->OwnerId = Other->OwnerId;
  this->Permissions = Other->Permissions;
  this->Inode = Other->Inode;
  return this;
}

Assistant:

FileInfo& FileInfo::operator=( const FileInfo& Other ) {
	this->Filepath = Other.Filepath;
	this->Size = Other.Size;
	this->ModificationTime = Other.ModificationTime;
	this->GroupId = Other.GroupId;
	this->OwnerId = Other.OwnerId;
	this->Permissions = Other.Permissions;
	this->Inode = Other.Inode;
	return *this;
}